

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_address.cpp
# Opt level: O0

int __thiscall zmq::udp_address_t::resolve(udp_address_t *this,char *name_,bool bind_,bool ipv6_)

{
  bool bVar1;
  undefined1 uVar2;
  uint16_t uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ip_resolver_options_t *piVar7;
  char *pcVar8;
  int *piVar9;
  byte in_CL;
  byte in_DL;
  ip_resolver_options_t opts_;
  char *in_RSI;
  long in_RDI;
  uint16_t port;
  int rc;
  ip_resolver_t resolver;
  ip_resolver_options_t resolver_opts;
  char *in_stack_000000c8;
  int rc_1;
  ip_addr_t *in_stack_000000d0;
  ip_resolver_t *in_stack_000000d8;
  ip_resolver_t src_resolver;
  ip_resolver_options_t src_resolver_opts;
  string src_name;
  char *src_delimiter;
  bool has_interface;
  undefined4 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  undefined2 uVar10;
  uint16_t in_stack_fffffffffffffeae;
  undefined2 uVar11;
  undefined4 in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  ip_resolver_t *this_00;
  int family_;
  undefined8 local_dc;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 uStack_c8;
  ip_resolver_t local_a8;
  ip_resolver_options_t local_96;
  int local_90;
  int local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  bool local_7c;
  bool bStack_7b;
  ip_resolver_t local_78;
  ip_resolver_options_t local_62 [4];
  allocator local_49;
  string local_48 [32];
  char *local_28;
  byte local_1b;
  byte local_1a;
  byte local_19;
  char *local_18;
  int local_4;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  local_1b = 0;
  local_18 = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x48),in_RSI);
  local_28 = strrchr(local_18,0x3b);
  pcVar8 = local_18;
  if (local_28 != (char *)0x0) {
    uVar6 = (long)local_28 - (long)local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar8,uVar6,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    ip_resolver_options_t::ip_resolver_options_t(local_62);
    piVar7 = ip_resolver_options_t::bindable(local_62,true);
    piVar7 = ip_resolver_options_t::allow_dns(piVar7,false);
    piVar7 = ip_resolver_options_t::allow_nic_name(piVar7,true);
    piVar7 = ip_resolver_options_t::ipv6(piVar7,(bool)(local_1a & 1));
    ip_resolver_options_t::expect_port(piVar7,false);
    local_7c = local_62[0]._dns_allowed;
    bStack_7b = local_62[0]._path_allowed;
    local_80._0_1_ = local_62[0]._bindable_wanted;
    local_80._1_1_ = local_62[0]._nic_name_allowed;
    local_80._2_1_ = local_62[0]._ipv6_wanted;
    local_80._3_1_ = local_62[0]._port_expected;
    local_84 = CONCAT22(local_84._2_2_,local_62[0]._4_2_);
    local_88._0_1_ = local_62[0]._bindable_wanted;
    local_88._1_1_ = local_62[0]._nic_name_allowed;
    local_88._2_1_ = local_62[0]._ipv6_wanted;
    local_88._3_1_ = local_62[0]._port_expected;
    ip_resolver_t::ip_resolver_t
              (&local_78,
               (ip_resolver_options_t)((uint6)(uint)local_62[0]._0_4_ | (uint6)local_84 << 0x20));
    std::__cxx11::string::c_str();
    local_8c = ip_resolver_t::resolve(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
    if (local_8c == 0) {
      bVar1 = ip_addr_t::is_multicast
                        ((ip_addr_t *)
                         CONCAT26(in_stack_fffffffffffffeae,
                                  CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)));
      if (bVar1) {
        piVar9 = __errno_location();
        *piVar9 = 0x16;
        local_4 = -1;
        local_90 = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffeb7,
                                          CONCAT16(in_stack_fffffffffffffeb6,
                                                   CONCAT24(in_stack_fffffffffffffeb4,
                                                            in_stack_fffffffffffffeb0))),
                                (char *)CONCAT26(in_stack_fffffffffffffeae,
                                                 CONCAT24(in_stack_fffffffffffffeac,
                                                          in_stack_fffffffffffffea8)));
        if (bVar1) {
          *(undefined4 *)(in_RDI + 0x24) = 0;
        }
        else {
          pcVar8 = (char *)std::__cxx11::string::c_str();
          uVar4 = if_nametoindex(pcVar8);
          *(uint *)(in_RDI + 0x24) = uVar4;
          if (*(int *)(in_RDI + 0x24) == 0) {
            *(undefined4 *)(in_RDI + 0x24) = 0xffffffff;
          }
        }
        local_1b = 1;
        local_18 = local_28 + 1;
        local_90 = 0;
      }
    }
    else {
      local_4 = -1;
      local_90 = 1;
    }
    ip_resolver_t::~ip_resolver_t(&local_78);
    std::__cxx11::string::~string(local_48);
    if (local_90 != 0) {
      return local_4;
    }
  }
  ip_resolver_options_t::ip_resolver_options_t(&local_96);
  piVar7 = ip_resolver_options_t::bindable(&local_96,(bool)(local_19 & 1));
  piVar7 = ip_resolver_options_t::allow_dns(piVar7,(bool)(~local_19 & 1));
  piVar7 = ip_resolver_options_t::allow_nic_name(piVar7,(bool)(local_19 & 1));
  piVar7 = ip_resolver_options_t::expect_port(piVar7,true);
  ip_resolver_options_t::ipv6(piVar7,(bool)(local_1a & 1));
  opts_._dns_allowed = local_96._dns_allowed;
  opts_._path_allowed = local_96._path_allowed;
  opts_._bindable_wanted = local_96._bindable_wanted;
  opts_._nic_name_allowed = local_96._nic_name_allowed;
  opts_._ipv6_wanted = local_96._ipv6_wanted;
  opts_._port_expected = local_96._port_expected;
  this_00 = &local_a8;
  ip_resolver_t::ip_resolver_t(this_00,opts_);
  family_ = (int)((ulong)this_00 >> 0x20);
  iVar5 = ip_resolver_t::resolve(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  if (iVar5 == 0) {
    uVar2 = ip_addr_t::is_multicast
                      ((ip_addr_t *)
                       CONCAT26(in_stack_fffffffffffffeae,
                                CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)));
    *(undefined1 *)(in_RDI + 0x44) = uVar2;
    uVar3 = ip_addr_t::port((ip_addr_t *)
                            CONCAT26(in_stack_fffffffffffffeae,
                                     CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)))
    ;
    if ((local_1b & 1) == 0) {
      if (((*(byte *)(in_RDI + 0x44) & 1) == 0) && ((local_19 & 1) != 0)) {
        *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x28);
        *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 0x30);
        *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x38);
        *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RDI + 0x40);
      }
      else {
        iVar5 = ip_addr_t::family((ip_addr_t *)(in_RDI + 0x28));
        ip_addr_t::any(family_);
        *(ulong *)(in_RDI + 0x14) = CONCAT44(uStack_cc,uStack_d0);
        *(undefined8 *)(in_RDI + 0x1c) = uStack_c8;
        *(undefined8 *)(in_RDI + 8) = local_dc;
        *(ulong *)(in_RDI + 0x10) = CONCAT44(uStack_d0,uStack_d4);
        ip_addr_t::set_port((ip_addr_t *)
                            CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffeb6,CONCAT24(uVar3,iVar5))
                                    ),in_stack_fffffffffffffeae);
        *(undefined4 *)(in_RDI + 0x24) = 0;
      }
    }
    else {
      if ((*(byte *)(in_RDI + 0x44) & 1) == 0) {
        piVar9 = __errno_location();
        *piVar9 = 0x16;
        local_4 = -1;
        goto LAB_002ef981;
      }
      ip_addr_t::set_port((ip_addr_t *)
                          CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffeb6,
                                                  CONCAT24(uVar3,in_stack_fffffffffffffeb0))),
                          in_stack_fffffffffffffeae);
    }
    iVar5 = ip_addr_t::family((ip_addr_t *)(in_RDI + 8));
    uVar10 = (undefined2)iVar5;
    uVar11 = (undefined2)((uint)iVar5 >> 0x10);
    iVar5 = ip_addr_t::family((ip_addr_t *)(in_RDI + 0x28));
    if (CONCAT22(uVar11,uVar10) == iVar5) {
      if ((((local_1a & 1) == 0) || ((*(byte *)(in_RDI + 0x44) & 1) == 0)) ||
         (-1 < *(int *)(in_RDI + 0x24))) {
        local_4 = 0;
      }
      else {
        piVar9 = __errno_location();
        *piVar9 = 0x13;
        local_4 = -1;
      }
    }
    else {
      piVar9 = __errno_location();
      *piVar9 = 0x16;
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
LAB_002ef981:
  local_90 = 1;
  ip_resolver_t::~ip_resolver_t(&local_a8);
  return local_4;
}

Assistant:

int zmq::udp_address_t::resolve (const char *name_, bool bind_, bool ipv6_)
{
    //  No IPv6 support yet
    bool has_interface = false;

    _address = name_;

    //  If we have a semicolon then we should have an interface specifier in the
    //  URL
    const char *src_delimiter = strrchr (name_, ';');
    if (src_delimiter) {
        const std::string src_name (name_, src_delimiter - name_);

        ip_resolver_options_t src_resolver_opts;

        src_resolver_opts
          .bindable (true)
          //  Restrict hostname/service to literals to avoid any DNS
          //  lookups or service-name irregularity due to
          //  indeterminate socktype.
          .allow_dns (false)
          .allow_nic_name (true)
          .ipv6 (ipv6_)
          .expect_port (false);

        ip_resolver_t src_resolver (src_resolver_opts);

        const int rc = src_resolver.resolve (&_bind_address, src_name.c_str ());

        if (rc != 0) {
            return -1;
        }

        if (_bind_address.is_multicast ()) {
            //  It doesn't make sense to have a multicast address as a source
            errno = EINVAL;
            return -1;
        }

        //  This is a hack because we need the interface index when binding
        //  multicast IPv6, we can't do it by address. Unfortunately for the
        //  time being we don't have a generic platform-independent function to
        //  resolve an interface index from an address, so we only support it
        //  when an actual interface name is provided.
        if (src_name == "*") {
            _bind_interface = 0;
        } else {
#ifdef HAVE_IF_NAMETOINDEX
            _bind_interface = if_nametoindex (src_name.c_str ());
            if (_bind_interface == 0) {
                //  Error, probably not an interface name.
                _bind_interface = -1;
            }
#endif
        }

        has_interface = true;
        name_ = src_delimiter + 1;
    }

    ip_resolver_options_t resolver_opts;

    resolver_opts.bindable (bind_)
      .allow_dns (!bind_)
      .allow_nic_name (bind_)
      .expect_port (true)
      .ipv6 (ipv6_);

    ip_resolver_t resolver (resolver_opts);

    const int rc = resolver.resolve (&_target_address, name_);
    if (rc != 0) {
        return -1;
    }

    _is_multicast = _target_address.is_multicast ();
    const uint16_t port = _target_address.port ();

    if (has_interface) {
        //  If we have an interface specifier then the target address must be a
        //  multicast address
        if (!_is_multicast) {
            errno = EINVAL;
            return -1;
        }

        _bind_address.set_port (port);
    } else {
        //  If we don't have an explicit interface specifier then the URL is
        //  ambiguous: if the target address is multicast then it's the
        //  destination address and the bind address is ANY, if it's unicast
        //  then it's the bind address when 'bind_' is true and the destination
        //  otherwise
        if (_is_multicast || !bind_) {
            _bind_address = ip_addr_t::any (_target_address.family ());
            _bind_address.set_port (port);
            _bind_interface = 0;
        } else {
            //  If we were asked for a bind socket and the address
            //  provided was not multicast then it was really meant as
            //  a bind address and the target_address is useless.
            _bind_address = _target_address;
        }
    }

    if (_bind_address.family () != _target_address.family ()) {
        errno = EINVAL;
        return -1;
    }

    //  For IPv6 multicast we *must* have an interface index since we can't
    //  bind by address.
    if (ipv6_ && _is_multicast && _bind_interface < 0) {
        errno = ENODEV;
        return -1;
    }

    return 0;
}